

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
edition_unittest::TestMixedFieldsAndExtensions::_InternalSerialize
          (TestMixedFieldsAndExtensions *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int32_t value;
  int iVar2;
  uint32_t *puVar3;
  TestMixedFieldsAndExtensions *pTVar4;
  RepeatedField<unsigned_int> *this_00;
  byte *pbVar5;
  LogMessage *pLVar6;
  const_pointer data;
  UnknownFieldSet *unknown_fields;
  uint32_t cached_has_bits;
  TestMixedFieldsAndExtensions *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestMixedFieldsAndExtensions *this_local;
  unsigned_long size;
  unsigned_long element_size;
  LogMessage local_58;
  Voidify local_41;
  byte *local_40;
  undefined4 local_38;
  undefined4 local_34;
  EpsCopyOutputStream *local_30;
  byte *local_28;
  uint local_1c;
  byte *local_18;
  uint local_c;
  
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  stream_local = (EpsCopyOutputStream *)target;
  if ((*puVar3 & 1) != 0) {
    value = _internal_a(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                             (stream,value,target);
  }
  pTVar4 = default_instance();
  stream_local = (EpsCopyOutputStream *)
                 google::protobuf::internal::ExtensionSet::_InternalSerialize
                           (&(this->field_0)._impl_._extensions_,(MessageLite *)pTVar4,2,3,
                            (uint8_t *)stream_local,stream);
  iVar2 = _internal_b_size(this);
  if (0 < iVar2) {
    this_00 = _internal_b(this);
    pbVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    iVar2 = google::protobuf::RepeatedField<unsigned_int>::size(this_00);
    local_34 = 3;
    local_38 = 2;
    local_40 = pbVar5;
    local_30 = stream;
    if (stream->end_ <= pbVar5) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar6);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_58);
    }
    local_1c = 0x1a;
    local_28 = pbVar5;
    while (0x7f < local_1c) {
      *local_28 = (byte)local_1c | 0x80;
      local_28 = local_28 + 1;
      local_1c = 0;
    }
    *local_28 = (byte)local_1c;
    local_18 = local_28 + 1;
    for (local_c = iVar2 << 2; 0x7f < local_c; local_c = local_c >> 7) {
      *local_18 = (byte)local_c | 0x80;
      local_18 = local_18 + 1;
    }
    pbVar5 = local_18 + 1;
    *local_18 = (byte)local_c;
    local_28 = local_28 + 1;
    local_18 = pbVar5;
    data = google::protobuf::RepeatedField<unsigned_int>::data(this_00);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRawLittleEndian<4>
                             (stream,data,iVar2 << 2,pbVar5);
  }
  pTVar4 = default_instance();
  stream_local = (EpsCopyOutputStream *)
                 google::protobuf::internal::ExtensionSet::_InternalSerialize
                           (&(this->field_0)._impl_._extensions_,(MessageLite *)pTVar4,4,5,
                            (uint8_t *)stream_local,stream);
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestMixedFieldsAndExtensions::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestMixedFieldsAndExtensions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestMixedFieldsAndExtensions)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 a = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_a(), target);
  }

  // Extension range [2, 3)
  target = this_._impl_._extensions_._InternalSerialize(
      &default_instance(), 2, 3, target, stream);
  // repeated fixed32 b = 3;
  if (this_._internal_b_size() > 0) {
    target = stream->WriteFixedPacked(3, this_._internal_b(), target);
  }

  // Extension range [4, 5)
  target = this_._impl_._extensions_._InternalSerialize(
      &default_instance(), 4, 5, target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestMixedFieldsAndExtensions)
  return target;
}